

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O2

shared_ptr<celero::Benchmark> __thiscall celero::TestVector::operator[](TestVector *this,size_t x)

{
  pthread_mutex_t *__mutex;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<celero::Benchmark> sVar1;
  
  __mutex = *(pthread_mutex_t **)x;
  std::mutex::lock((mutex *)&__mutex->__data);
  std::__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> *)
             (in_RDX * 0x10 + *(long *)(*(long *)x + 0x28)));
  pthread_mutex_unlock(__mutex);
  sVar1.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Benchmark>)
         sVar1.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Benchmark> TestVector::operator[](size_t x)
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);
	return this->pimpl->testVector[x];
}